

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O3

dynlink ext_loader_impl_load_from_file_dynlink(char *path,char *library_name)

{
  char cVar1;
  size_t sVar2;
  dynlink pdVar3;
  path lib_path;
  dynlink_name_impl platform_name;
  char *local_1058;
  path local_1050;
  char local_1028 [4104];
  
  local_1058 = path;
  dynlink_platform_name(library_name,local_1028);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_1050,&local_1058,auto_format);
  sVar2 = strlen(local_1028);
  std::filesystem::__cxx11::path::_M_append(&local_1050,sVar2,local_1028);
  cVar1 = std::filesystem::status(&local_1050);
  pdVar3 = (dynlink)0x0;
  if ((cVar1 != '\0') && (cVar1 != -1)) {
    pdVar3 = (dynlink)dynlink_load(local_1058,library_name,10);
  }
  std::filesystem::__cxx11::path::~path(&local_1050);
  return pdVar3;
}

Assistant:

dynlink ext_loader_impl_load_from_file_dynlink(const char *path, const char *library_name)
{
	/* This function will try to check if the library exists before loading it,
	so we avoid error messages from dynlink when guessing the file path for relative load from file */
	dynlink_name_impl platform_name;

	dynlink_platform_name(library_name, platform_name);

	fs::path lib_path(path);

	lib_path /= platform_name;

	if (fs::exists(lib_path) == false)
	{
		return NULL;
	}

	return dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);
}